

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O1

void __thiscall Bezier<3,_2>::derivativePrecompute(Bezier<3,_2> *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  PointsType *pPVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  this->derivative_precal_prefix_[0] = 1;
  this->derivative_precal_prefix_[1] = 3;
  pPVar6 = this->derivative_precal_points_;
  lVar7 = 1;
  lVar8 = 0;
  do {
    pPVar6 = pPVar6 + 1;
    lVar9 = -0x30;
    do {
      pdVar1 = (double *)
               ((long)(pPVar6->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).
                      m_storage.m_data.array + lVar9);
      dVar4 = pdVar1[1];
      pdVar2 = (double *)
               ((long)(pPVar6->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).
                      m_storage.m_data.array + lVar9 + -0x10);
      dVar5 = pdVar2[1];
      pdVar3 = (double *)
               ((long)(pPVar6->super_PlainObjectBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>).
                      m_storage.m_data.array + lVar9 + 0x30);
      *pdVar3 = *pdVar1 - *pdVar2;
      pdVar3[1] = dVar4 - dVar5;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 != lVar9);
    this->derivative_precal_prefix_[lVar7] =
         (4 - (int)lVar7) * this->derivative_precal_prefix_[lVar7 + -1];
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + -0x10;
  } while (lVar7 != 4);
  return;
}

Assistant:

void derivativePrecompute() {
    derivative_precal_prefix_[0] = 1;
    derivative_precal_prefix_[1] = N;
    for (int k = 1; k <= N; ++k) {
      int I_range = N - k;
      for (int i = 0; i <= I_range; ++i) {
        derivative_precal_points_[k].col(i) =
            derivative_precal_points_[k - 1].col(i + 1) - derivative_precal_points_[k - 1].col(i);
      }

      derivative_precal_prefix_[k] = derivative_precal_prefix_[k - 1] * (N - k + 1);
    }
  }